

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNodePtr xmlFirstElementChild(xmlNodePtr parent)

{
  xmlElementType xVar1;
  xmlNodePtr local_20;
  xmlNodePtr cur;
  xmlNodePtr parent_local;
  
  if ((parent != (xmlNodePtr)0x0) &&
     ((((xVar1 = parent->type, xVar1 == XML_ELEMENT_NODE || (xVar1 == XML_ENTITY_NODE)) ||
       (xVar1 == XML_DOCUMENT_NODE)) ||
      ((xVar1 == XML_DOCUMENT_FRAG_NODE || (xVar1 == XML_HTML_DOCUMENT_NODE)))))) {
    for (local_20 = parent->children; local_20 != (xmlNodePtr)0x0; local_20 = local_20->next) {
      if (local_20->type == XML_ELEMENT_NODE) {
        return local_20;
      }
    }
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlFirstElementChild(xmlNodePtr parent) {
    xmlNodePtr cur = NULL;

    if (parent == NULL)
        return(NULL);
    switch (parent->type) {
        case XML_ELEMENT_NODE:
        case XML_ENTITY_NODE:
        case XML_DOCUMENT_NODE:
        case XML_DOCUMENT_FRAG_NODE:
        case XML_HTML_DOCUMENT_NODE:
            cur = parent->children;
            break;
        default:
            return(NULL);
    }
    while (cur != NULL) {
        if (cur->type == XML_ELEMENT_NODE)
            return(cur);
        cur = cur->next;
    }
    return(NULL);
}